

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_keywords.cpp
# Opt level: O3

void duckdb::DuckDBKeywordsFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  idx_t iVar1;
  pointer pcVar2;
  reference pvVar3;
  InternalException *this;
  _func_int **__n;
  ulong index;
  bool bVar4;
  string category_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  GlobalTableFunctionState *local_c0;
  vector<duckdb::ParserKeyword,_true> *local_b8;
  string local_b0;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  local_c0 = (data_p->global_state).ptr;
  __n = local_c0[4]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)
            (((long)local_c0[2]._vptr_GlobalTableFunctionState -
              (long)local_c0[1]._vptr_GlobalTableFunctionState >> 3) * -0x3333333333333333)) {
    local_b8 = (vector<duckdb::ParserKeyword,_true> *)(local_c0 + 1);
    index = 0;
    do {
      local_c0[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar3 = vector<duckdb::ParserKeyword,_true>::operator[](local_b8,(size_type)__n);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar2 = (pvVar3->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (pvVar3->name)._M_string_length);
      Value::Value(&local_70,&local_90);
      DataChunk::SetValue(output,0,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      if (3 < (ulong)pvVar3->category) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_70.type_._0_8_ = (long)&local_70 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"Unrecognized keyword category","");
        InternalException::InternalException(this,(string *)&local_70);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_e0,0,(char *)0x0,
                 (ulong)(&DAT_01374cb8 + *(int *)(&DAT_01374cb8 + (ulong)pvVar3->category * 4)));
      if (local_e0 == &local_d0) {
        local_b0.field_2._8_8_ = local_d0._8_8_;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0._M_dataplus._M_p = (pointer)local_e0;
      }
      local_b0.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
      local_b0.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
      local_b0._M_string_length = local_d8;
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_e0 = &local_d0;
      Value::Value(&local_70,&local_b0);
      DataChunk::SetValue(output,1,index,&local_70);
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0);
      }
      __n = local_c0[4]._vptr_GlobalTableFunctionState;
      iVar1 = index + 1;
    } while ((__n < (_func_int **)
                    (((long)local_c0[2]._vptr_GlobalTableFunctionState -
                      (long)local_c0[1]._vptr_GlobalTableFunctionState >> 3) * -0x3333333333333333))
            && (bVar4 = index < 0x7ff, index = iVar1, bVar4));
    output->count = iVar1;
  }
  return;
}

Assistant:

void DuckDBKeywordsFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBKeywordsData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];

		// keyword_name, VARCHAR
		output.SetValue(0, count, Value(entry.name));
		// keyword_category, VARCHAR
		string category_name;
		switch (entry.category) {
		case KeywordCategory::KEYWORD_RESERVED:
			category_name = "reserved";
			break;
		case KeywordCategory::KEYWORD_UNRESERVED:
			category_name = "unreserved";
			break;
		case KeywordCategory::KEYWORD_TYPE_FUNC:
			category_name = "type_function";
			break;
		case KeywordCategory::KEYWORD_COL_NAME:
			category_name = "column_name";
			break;
		default:
			throw InternalException("Unrecognized keyword category");
		}
		output.SetValue(1, count, Value(std::move(category_name)));

		count++;
	}
	output.SetCardinality(count);
}